

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Program.cpp
# Opt level: O2

Module * __thiscall
soul::Program::ProgramImpl::insert(ProgramImpl *this,int index,Module *newModule)

{
  vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_> *this_00;
  value_type local_10;
  
  this_00 = &this->modules;
  if (index < 0) {
    std::vector<soul::pool_ref<soul::Module>,std::allocator<soul::pool_ref<soul::Module>>>::
    emplace_back<soul::Module&>
              ((vector<soul::pool_ref<soul::Module>,std::allocator<soul::pool_ref<soul::Module>>> *)
               this_00,newModule);
  }
  else {
    local_10.object = newModule;
    std::vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>::
    _M_insert_rval(this_00,(this_00->
                           super__Vector_base<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>
                           )._M_impl.super__Vector_impl_data._M_start + (uint)index,&local_10);
  }
  return newModule;
}

Assistant:

Module& insert (int index, Module& newModule)
    {
        if (index < 0)
            modules.emplace_back (newModule);
        else
            modules.insert (modules.begin() + index, newModule);

        return newModule;
    }